

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  long lVar1;
  long *plVar2;
  long lVar3;
  Printer *pPVar4;
  FileDescriptor *pFVar5;
  char *pcVar6;
  size_type sVar7;
  long lVar8;
  string constant_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  
  pFVar5 = this->file_;
  if (0 < *(int *)(pFVar5 + 0x3c)) {
    buffer = &local_60.field_2;
    lVar8 = 0;
    do {
      lVar1 = *(long *)(pFVar5 + 0x70);
      plVar2 = *(long **)(lVar1 + 8 + lVar8 * 0x48);
      constant_name._M_dataplus._M_p = (pointer)&constant_name.field_2;
      lVar3 = *plVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&constant_name,lVar3,plVar2[1] + lVar3);
      std::__cxx11::string::append((char *)&constant_name);
      if (constant_name._M_string_length != 0) {
        sVar7 = 0;
        do {
          if ((byte)(constant_name._M_dataplus._M_p[sVar7] + 0x9fU) < 0x1a) {
            constant_name._M_dataplus._M_p[sVar7] = constant_name._M_dataplus._M_p[sVar7] + -0x20;
          }
          sVar7 = sVar7 + 1;
        } while (constant_name._M_string_length != sVar7);
      }
      lVar1 = lVar1 + lVar8 * 0x48;
      pPVar4 = this->printer_;
      local_60._M_dataplus._M_p = (pointer)buffer;
      pcVar6 = FastInt32ToBufferLeft(*(int32 *)(lVar1 + 4),buffer->_M_local_buf);
      local_60._M_string_length = (long)pcVar6 - (long)buffer;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
                (pPVar4,"$constant_name$ = $number$\n",(char (*) [14])0x40753e,&constant_name,
                 (char (*) [7])0x40a31d,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      pPVar4 = this->printer_;
      anon_unknown_0::ResolveKeyword(&local_60,*(string **)(lVar1 + 8));
      io::Printer::
      Print<char[14],std::__cxx11::string,char[5],char[11],char[5],std::__cxx11::string>
                (pPVar4,"$resolved_name$ = $file$.extensions_by_name[\'$name$\']\n",
                 (char (*) [14])"resolved_name",&local_60,(char (*) [5])0x3f0124,
                 (char (*) [11])"DESCRIPTOR",(char (*) [5])0x3f58c9,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar1 + 8))
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != buffer) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)constant_name._M_dataplus._M_p != &constant_name.field_2) {
        operator_delete(constant_name._M_dataplus._M_p);
      }
      lVar8 = lVar8 + 1;
      pFVar5 = this->file_;
    } while (lVar8 < *(int *)(pFVar5 + 0x3c));
  }
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    std::string constant_name = extension_field.name() + "_FIELD_NUMBER";
    ToUpper(&constant_name);
    printer_->Print("$constant_name$ = $number$\n", "constant_name",
                    constant_name, "number",
                    StrCat(extension_field.number()));
    printer_->Print(
        "$resolved_name$ = "
        "$file$.extensions_by_name['$name$']\n",
        "resolved_name", ResolveKeyword(extension_field.name()), "file",
        kDescriptorKey, "name", extension_field.name());
  }
  printer_->Print("\n");
}